

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::detail::EachMatcher<iutest::detail::AnythingMatcher>::operator()
          (AssertionResult *__return_storage_ptr__,
          EachMatcher<iutest::detail::AnythingMatcher> *this,int (*actual) [3])

{
  bool bVar1;
  int *begin;
  int *end;
  AssertionResult *rhs;
  string local_68;
  AssertionResult local_48;
  int (*local_20) [3];
  int (*actual_local) [3];
  EachMatcher<iutest::detail::AnythingMatcher> *this_local;
  
  local_20 = actual;
  actual_local = (int (*) [3])this;
  this_local = (EachMatcher<iutest::detail::AnythingMatcher> *)__return_storage_ptr__;
  begin = std::begin<int_const,3ul>(actual);
  end = std::end<int_const,3ul>(local_20);
  bVar1 = Each<int_const*>(this,begin,end);
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    AssertionFailure();
    WhichIs_abi_cxx11_(&local_68,this);
    rhs = AssertionResult::operator<<(&local_48,&local_68);
    AssertionResult::AssertionResult(__return_storage_ptr__,rhs);
    std::__cxx11::string::~string((string *)&local_68);
    AssertionResult::~AssertionResult(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( Each(begin(actual), end(actual)) )
        {
            return AssertionSuccess();
        }